

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O2

int __thiscall prometheus::Gateway::DeleteForInstance(Gateway *this)

{
  CurlWrapper *this_00;
  int iVar1;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  this_00 = (this->curlWrapper_)._M_t.
            super___uniq_ptr_impl<prometheus::detail::CurlWrapper,_std::default_delete<prometheus::detail::CurlWrapper>_>
            ._M_t.
            super__Tuple_impl<0UL,_prometheus::detail::CurlWrapper_*,_std::default_delete<prometheus::detail::CurlWrapper>_>
            .super__Head_base<0UL,_prometheus::detail::CurlWrapper_*,_false>._M_head_impl;
  ::std::operator+(&local_30,&this->jobUri_,&this->labels_);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  iVar1 = detail::CurlWrapper::performHttpRequest(this_00,Delete,&local_30,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  return iVar1;
}

Assistant:

int Gateway::DeleteForInstance() {
  return curlWrapper_->performHttpRequest(detail::HttpMethod::Delete,
                                          jobUri_ + labels_);
}